

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O0

void __thiscall OpenMD::OpenMDBitSet::flip(OpenMDBitSet *this,size_t bitIndex)

{
  bool bVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference rVar2;
  _Bit_type *local_30;
  _Bit_type *__n;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  
  __n = local_30;
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffffe0,(size_type)local_30);
  this_00 = (vector<bool,_std::allocator<bool>_> *)rVar2._M_p;
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffe0);
  _local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator=((_Bit_reference *)&local_30,(bool)((bVar1 ^ 0xffU) & 1));
  return;
}

Assistant:

void flip(size_t bitIndex) { bitset_[bitIndex] = !bitset_[bitIndex]; }